

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O3

VarnodeData * __thiscall PcodeCacher::expandPool(PcodeCacher *this,uint4 size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  VarnodeData *pVVar3;
  pointer pPVar4;
  undefined8 uVar5;
  _List_node_base *p_Var6;
  VarnodeData *pVVar7;
  VarnodeData **ppVVar8;
  uint uVar9;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar10;
  ulong uVar17;
  
  pVVar3 = this->poolstart;
  pVVar7 = this->curpool;
  iVar10 = (int)((ulong)((long)this->endpool - (long)pVVar3) >> 3);
  uVar9 = iVar10 * -0x55555555;
  uVar15 = ((long)pVVar7 - (long)pVVar3 >> 3) * -0x5555555555555555;
  uVar13 = size + (int)uVar15;
  uVar12 = uVar13 + iVar10 * 0x55555555;
  if (uVar9 <= uVar13 && uVar12 != 0) {
    uVar16 = 100;
    if (100 < uVar12) {
      uVar16 = uVar12;
    }
    uVar17 = (ulong)(uVar16 + uVar9);
    pVVar7 = (VarnodeData *)operator_new__(uVar17 * 0x18);
    if ((int)uVar15 != 0) {
      lVar11 = 0;
      do {
        *(undefined8 *)((long)&pVVar7->size + lVar11) =
             *(undefined8 *)((long)&pVVar3->size + lVar11);
        puVar1 = (undefined8 *)((long)&pVVar3->space + lVar11);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pVVar7->space + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar11 = lVar11 + 0x18;
      } while ((uVar15 & 0xffffffff) * 0x18 != lVar11);
    }
    pPVar4 = (this->issued).super__Vector_base<PcodeData,_std::allocator<PcodeData>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar11 = (long)(this->issued).super__Vector_base<PcodeData,_std::allocator<PcodeData>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pPVar4;
    if (lVar11 != 0) {
      ppVVar8 = &pPVar4->invar;
      uVar9 = 1;
      do {
        if (ppVVar8[-1] != (VarnodeData *)0x0) {
          ppVVar8[-1] = (VarnodeData *)(((long)ppVVar8[-1] - (long)pVVar3) + (long)pVVar7);
        }
        if (*ppVVar8 != (VarnodeData *)0x0) {
          *ppVVar8 = (VarnodeData *)(((long)*ppVVar8 - (long)pVVar3) + (long)pVVar7);
        }
        uVar14 = (ulong)uVar9;
        ppVVar8 = ppVVar8 + 4;
        uVar9 = uVar9 + 1;
      } while (uVar14 < (ulong)(lVar11 >> 5));
    }
    p_Var6 = (this->label_refs).super__List_base<RelativeRecord,_std::allocator<RelativeRecord>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while (p_Var6 != (_List_node_base *)&this->label_refs) {
      p_Var6[1]._M_next =
           (_List_node_base *)(((long)p_Var6[1]._M_next - (long)pVVar3) + (long)pVVar7);
      p_Var6 = p_Var6->_M_next;
    }
    if (pVVar3 != (VarnodeData *)0x0) {
      operator_delete__(pVVar3);
    }
    this->poolstart = pVVar7;
    this->curpool = pVVar7 + uVar13;
    this->endpool = pVVar7 + uVar17;
    pVVar7 = pVVar7 + (uVar15 & 0xffffffff);
  }
  return pVVar7;
}

Assistant:

VarnodeData *PcodeCacher::expandPool(uint4 size)

{ // Expand the pool so that -size- more elements fit
  // Return pointer to first available element
  uint4 curmax = endpool - poolstart;
  uint4 cursize = curpool - poolstart;
  if (cursize + size <= curmax)
    return curpool;		// No expansion necessary
  uint4 increase = (cursize + size) - curmax;
  if (increase < 100)		// Increase by at least 100
    increase = 100;

  uint4 newsize = curmax + increase;

  VarnodeData *newpool = new VarnodeData[newsize];
  for(uint4 i=0;i<cursize;++i)
    newpool[i] = poolstart[i];	// Copy old data
  // Update references to the old pool
  for(uint4 i=0;i<issued.size();++i) {
    VarnodeData *outvar = issued[i].outvar;
    if (outvar != (VarnodeData *)0) {
      outvar = newpool + (outvar - poolstart);
      issued[i].outvar = outvar;
    }
    VarnodeData *invar = issued[i].invar;
    if (invar != (VarnodeData *)0) {
      invar = newpool + (invar - poolstart);
      issued[i].invar = invar;
    }
  }
  list<RelativeRecord>::iterator iter;
  for(iter=label_refs.begin();iter!=label_refs.end();++iter) {
    VarnodeData *ref = (*iter).dataptr;
    (*iter).dataptr = newpool + (ref - poolstart);
  }
  
  delete [] poolstart;		// Free up old pool
  poolstart = newpool;
  curpool = newpool + (cursize + size);
  endpool = newpool + newsize;
  return newpool + cursize;
}